

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wchar_t * fmt::v5::internal::
          parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>&,wchar_t>>
                    (wchar_t *begin,wchar_t *end,
                    id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
                    *handler)

{
  long lVar1;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *pfVar2;
  error_handler *peVar3;
  uint id;
  long lVar4;
  wchar_t wVar5;
  error_handler *peVar6;
  basic_string_view<wchar_t> name;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_1
  local_48;
  type local_38;
  
  wVar5 = *begin;
  if ((wVar5 == L'}') || (wVar5 == L':')) {
    pfVar2 = handler->handler;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
    ::next_arg((format_arg *)&local_48.string,&pfVar2->context);
    (pfVar2->arg).type_ = local_38;
    (pfVar2->arg).value_.field_0.long_long_value = local_48.long_long_value;
    (pfVar2->arg).value_.field_0.string.size = local_48.string.size;
    peVar6 = (error_handler *)begin;
  }
  else if ((uint)(wVar5 + L'\xffffffd0') < 10) {
    peVar6 = (error_handler *)(begin + 1);
    id = 0;
    peVar3 = peVar6;
    if (wVar5 != L'0') {
      do {
        peVar6 = peVar3;
        begin = (wchar_t *)peVar6;
        if (0xccccccc < id) goto LAB_0014896d;
        id = (wVar5 + id * 10) - 0x30;
        if (peVar6 == (error_handler *)end) break;
        wVar5 = *(wchar_t *)peVar6;
        begin = (wchar_t *)(peVar6 + 4);
        peVar3 = (error_handler *)begin;
      } while ((uint)(wVar5 + L'\xffffffd0') < 10);
      if ((int)id < 0) {
LAB_0014896d:
        error_handler::on_error((error_handler *)begin,"number is too big");
      }
    }
    if ((peVar6 == (error_handler *)end) ||
       ((*(wchar_t *)peVar6 != L':' && (*(wchar_t *)peVar6 != L'}')))) {
LAB_00148979:
      error_handler::on_error((error_handler *)begin,"invalid format string");
    }
    format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
    ::on_arg_id(handler->handler,id);
  }
  else {
    if ((wVar5 != L'_') && (0x19 < (uint)((wVar5 & 0xffffffdfU) - 0x41U))) goto LAB_00148979;
    lVar1 = 4;
    do {
      lVar4 = lVar1;
      peVar6 = (error_handler *)((long)begin + lVar4);
      if (peVar6 == (error_handler *)end) break;
      wVar5 = *(wchar_t *)peVar6;
      lVar1 = lVar4 + 4;
    } while ((((uint)(wVar5 + L'\xffffffd0') < 10) || (wVar5 == L'_')) ||
            ((uint)((wVar5 & 0xffffffdfU) - 0x41U) < 0x1a));
    name.size_ = lVar4 >> 2;
    pfVar2 = handler->handler;
    name.data_ = begin;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
    ::get_arg((format_arg *)&local_48.string,&pfVar2->context,name);
    (pfVar2->arg).type_ = local_38;
    (pfVar2->arg).value_.field_0.long_long_value = local_48.long_long_value;
    (pfVar2->arg).value_.field_0.string.size = local_48.string.size;
  }
  return (wchar_t *)peVar6;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}